

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_setStringOptionValue(void *highs,char *option,char *value)

{
  HighsStatus HVar1;
  char *in_RDX;
  char *in_RSI;
  string *in_stack_00000008;
  string *in_stack_00000010;
  Highs *in_stack_00000018;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  char *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,local_18,&local_71);
  HVar1 = Highs::setOptionValue(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return HVar1;
}

Assistant:

HighsInt Highs_setStringOptionValue(void* highs, const char* option,
                                    const char* value) {
  return (HighsInt)((Highs*)highs)
      ->setOptionValue(std::string(option), std::string(value));
}